

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::ParamSpec::InternalSerializeWithCachedSizesToArray
          (ParamSpec *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.ParamSpec.name");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (2,this->share_mode_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(3,this->lr_mult_,target);
  }
  if ((uVar1 & 8) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (4,this->decay_mult_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = ParamSpec::unknown_fields(this);
  puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* ParamSpec::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ParamSpec)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ParamSpec.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional .caffe.ParamSpec.DimCheckMode share_mode = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      2, this->share_mode(), target);
  }

  // optional float lr_mult = 3 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->lr_mult(), target);
  }

  // optional float decay_mult = 4 [default = 1];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(4, this->decay_mult(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ParamSpec)
  return target;
}